

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::rebuild
          (HighsCliqueTable *this,HighsInt ncols,HighsPostsolveStack *postSolveStack,
          HighsDomain *globaldomain,vector<int,_std::allocator<int>_> *orig2reducedcol,
          vector<int,_std::allocator<int>_> *orig2reducedrow)

{
  int iVar1;
  uint col;
  pointer pCVar2;
  pointer pCVar3;
  bool bVar4;
  pointer pCVar5;
  pointer pCVar6;
  HighsInt numcliquevars;
  pointer pCVar7;
  long lVar8;
  long lVar9;
  pointer pCVar10;
  long lVar11;
  pointer pCVar12;
  long lVar13;
  ulong uVar14;
  HighsInt k;
  long lVar15;
  HighsCliqueTable newCliqueTable;
  
  HighsCliqueTable(&newCliqueTable,ncols);
  newCliqueTable.inPresolve = this->inPresolve;
  newCliqueTable.minEntriesForParallelism = this->minEntriesForParallelism;
  pCVar2 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar3 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar14 = 0;
  do {
    if (uVar14 == (((long)pCVar2 - (long)pCVar3) / 0x14 & 0xffffffffU)) {
      operator=(this,&newCliqueTable);
      ~HighsCliqueTable(&newCliqueTable);
      return;
    }
    pCVar6 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (long)pCVar6[uVar14].start;
    if (lVar15 != -1) {
      while( true ) {
        iVar1 = pCVar6[uVar14].end;
        pCVar5 = (this->cliqueentries).
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((int)lVar15 == iVar1) break;
        col = (orig2reducedcol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[(uint)pCVar5[lVar15] & 0x7fffffff];
        if ((long)(int)col == -1) {
LAB_0027ae84:
          pCVar5[lVar15] = (CliqueVar)((uint)pCVar5[lVar15] | 0x7fffffff);
        }
        else {
          bVar4 = HighsDomain::isBinary(globaldomain,col);
          if (!bVar4) {
            pCVar5 = (this->cliqueentries).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0027ae84;
          }
          pCVar5 = (this->cliqueentries).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((postSolveStack->linearlyTransformable).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[(int)col] == '\0') goto LAB_0027ae84;
          pCVar5[lVar15] = (CliqueVar)((uint)pCVar5[lVar15] & 0x80000000 | col & 0x7fffffff);
        }
        lVar15 = lVar15 + 1;
        pCVar6 = (this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar8 = (long)pCVar6[uVar14].start;
      pCVar7 = pCVar5 + iVar1;
      lVar13 = (long)iVar1 * 4;
      lVar11 = lVar8 * -4;
      lVar15 = lVar8 * 4 + 0xc;
      for (lVar9 = lVar13 + lVar8 * -4 >> 4; 0 < lVar9; lVar9 = lVar9 + -1) {
        if ((~*(uint *)(&pCVar5[-3].field_0x0 + lVar15) & 0x7fffffff) == 0) {
          pCVar10 = (pointer)((long)pCVar5 - lVar11);
          goto LAB_0027afa4;
        }
        if ((~*(uint *)(&pCVar5[-2].field_0x0 + lVar15) & 0x7fffffff) == 0) {
          pCVar10 = (pointer)((long)pCVar5 + (4 - lVar11));
          goto LAB_0027afa4;
        }
        if ((~*(uint *)(&pCVar5[-1].field_0x0 + lVar15) & 0x7fffffff) == 0) {
          pCVar10 = (pointer)((long)pCVar5 + (8 - lVar11));
          goto LAB_0027afa4;
        }
        if ((~*(uint *)(&pCVar5->field_0x0 + lVar15) & 0x7fffffff) == 0) {
          pCVar10 = (pointer)((long)pCVar5 + (0xc - lVar11));
          goto LAB_0027afa4;
        }
        lVar11 = lVar11 + -0x10;
        lVar15 = lVar15 + 0x10;
      }
      lVar9 = lVar13 + lVar11 >> 2;
      pCVar10 = (pointer)((long)pCVar5 - lVar11);
      if (lVar9 == 1) {
LAB_0027b049:
        if ((~(uint)*pCVar10 & 0x7fffffff) != 0) {
          pCVar10 = pCVar7;
        }
LAB_0027afa4:
        pCVar12 = pCVar10;
        if (pCVar10 != pCVar7) {
          while (pCVar10 = pCVar10 + 1, pCVar10 != pCVar7) {
            if ((~(uint)*pCVar10 & 0x7fffffff) != 0) {
              *pCVar12 = *pCVar10;
              pCVar12 = pCVar12 + 1;
            }
          }
          pCVar5 = (this->cliqueentries).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pCVar6 = (this->cliques).
                   super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = (long)pCVar6[uVar14].start;
          pCVar7 = pCVar12;
        }
      }
      else {
        if (lVar9 == 2) {
LAB_0027b02b:
          if ((~(uint)*pCVar10 & 0x7fffffff) != 0) {
            pCVar10 = pCVar10 + 1;
            goto LAB_0027b049;
          }
          goto LAB_0027afa4;
        }
        if (lVar9 == 3) {
          if ((~*(uint *)(&pCVar5[-3].field_0x0 + lVar15) & 0x7fffffff) != 0) {
            pCVar10 = (pointer)((long)pCVar5 + (4 - lVar11));
            goto LAB_0027b02b;
          }
          goto LAB_0027afa4;
        }
      }
      numcliquevars = (HighsInt)((ulong)((long)pCVar7 - (long)(pCVar5 + lVar8)) >> 2);
      if (1 < numcliquevars) {
        doAddClique(&newCliqueTable,pCVar5 + lVar8,numcliquevars,false,
                    (uint)(pCVar6[uVar14].origin != 0x7fffffff) << 0x1f | 0x7fffffff);
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void HighsCliqueTable::rebuild(
    HighsInt ncols, const presolve::HighsPostsolveStack& postSolveStack,
    const HighsDomain& globaldomain,
    const std::vector<HighsInt>& orig2reducedcol,
    const std::vector<HighsInt>& orig2reducedrow) {
  HighsCliqueTable newCliqueTable(ncols);
  newCliqueTable.setPresolveFlag(inPresolve);
  newCliqueTable.setMinEntriesForParallelism(minEntriesForParallelism);
  HighsInt ncliques = cliques.size();
  for (HighsInt i = 0; i != ncliques; ++i) {
    if (cliques[i].start == -1) continue;

    for (HighsInt k = cliques[i].start; k != cliques[i].end; ++k) {
      HighsInt col = orig2reducedcol[cliqueentries[k].col];

      if (col == -1 || !globaldomain.isBinary(col) ||
          !postSolveStack.isColLinearlyTransformable(col))
        cliqueentries[k].col = kHighsIInf;
      else
        cliqueentries[k].col = col;
    }

    auto newend =
        std::remove_if(cliqueentries.begin() + cliques[i].start,
                       cliqueentries.begin() + cliques[i].end,
                       [](CliqueVar v) { return v.col == kHighsIInf; });
    HighsInt numvars = newend - (cliqueentries.begin() + cliques[i].start);
    // since we do not know how variables in the clique that have been deleted
    // are replaced (i.e. are they fixed to 0 or 1, or substituted) we relax
    // them out which means the equality status needs to be set to false
    if (numvars <= 1) continue;

    HighsInt origin = cliques[i].origin != kHighsIInf ? -1 : kHighsIInf;
    newCliqueTable.doAddClique(&cliqueentries[cliques[i].start], numvars, false,
                               origin);
  }

  *this = std::move(newCliqueTable);
}